

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

void __thiscall
crampl::detail::Function<std::tuple<int,int>(),false>::
Function<crampl::detail::Function<std::tuple<int,int>(),false>>
          (Function<std::tuple<int,int>(),false> *this,
          Function<std::tuple<int,_int>_(),_false> *lambda)

{
  *(code **)(this + 8) = Function<std::tuple<int,_int>_(),_false>::bad_invoke;
  *(code **)(this + 0x10) = Function<std::tuple<int,_int>_(),_false>::noop_manager;
  Function<std::tuple<int,_int>_(),_false>::init_from
            ((Function<std::tuple<int,_int>_(),_false> *)this,lambda);
  return;
}

Assistant:

Function(T&& lambda) noexcept {
		init_from(std::forward<T>(lambda));
	}